

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O0

vm_meta_entry_t * __thiscall CVmMetaTable::get_entry_by_id(CVmMetaTable *this,char *id)

{
  int iVar1;
  char *__s2;
  char *in_RSI;
  undefined8 *in_RDI;
  char *entry_vsn;
  size_t entry_name_len;
  vm_meta_entry_t *entry;
  size_t i;
  char *vsn;
  size_t name_len;
  size_t local_40;
  vm_meta_entry_t *local_38;
  ulong local_30;
  char *local_28;
  size_t local_20;
  char *local_18;
  
  local_18 = in_RSI;
  local_28 = lib_find_vsn_suffix(in_RSI,'/',"000000",&local_20);
  local_30 = 0;
  local_38 = (vm_meta_entry_t *)*in_RDI;
  while( true ) {
    if ((ulong)in_RDI[2] <= local_30) {
      return (vm_meta_entry_t *)0x0;
    }
    __s2 = lib_find_vsn_suffix(local_38->image_meta_name_,'/',"000000",&local_40);
    if ((local_20 == local_40) &&
       (iVar1 = memcmp(local_18,local_38->image_meta_name_,local_20), iVar1 == 0)) break;
    local_38 = local_38 + 1;
    local_30 = local_30 + 1;
  }
  iVar1 = strcmp(local_28,__s2);
  if (iVar1 < 1) {
    return local_38;
  }
  return (vm_meta_entry_t *)0x0;
}

Assistant:

vm_meta_entry_t *CVmMetaTable::get_entry_by_id(const char *id) const
{
    /* find the version suffix in the metaclass name, if any */
    size_t name_len;
    const char *vsn = lib_find_vsn_suffix(id, '/', "000000", &name_len);

    /* look up the metaclass by name */
    size_t i;
    vm_meta_entry_t *entry;
    for (i = 0, entry = table_ ; i < count_ ; ++entry, ++i)
    {
        /* find the version number in this entry */
        size_t entry_name_len;
        const char *entry_vsn = lib_find_vsn_suffix(
            entry->image_meta_name_, '/', "000000", &entry_name_len);

        /* see if this is a match */
        if (name_len == entry_name_len
            && memcmp(id, entry->image_meta_name_, name_len) == 0)
        {
            /* 
             *   we found a match to the name; make sure the version is at
             *   least as high as requested 
             */
            if (strcmp(vsn, entry_vsn) <= 0)
            {
                /* the loaded version is at least as new, so return it */
                return entry;
            }
            else
            {
                /* it's too old, so it's effectively not available */
                return 0;
            }
        }
    }

    /* didn't find a match */
    return 0;
}